

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall
Fl_Tree_Item::draw_horizontal_connector(Fl_Tree_Item *this,int x1,int x2,int y,Fl_Tree_Prefs *prefs)

{
  Fl_Color c;
  Fl_Tree_Connector FVar1;
  uint local_2c;
  int xx;
  Fl_Tree_Prefs *prefs_local;
  int y_local;
  int x2_local;
  int x1_local;
  Fl_Tree_Item *this_local;
  
  c = Fl_Tree_Prefs::connectorcolor(prefs);
  fl_color(c);
  FVar1 = Fl_Tree_Prefs::connectorstyle(prefs);
  if (FVar1 != FL_TREE_CONNECTOR_NONE) {
    if (FVar1 == FL_TREE_CONNECTOR_DOTTED) {
      for (local_2c = x1 | 1; (int)local_2c <= x2; local_2c = local_2c + 2) {
        fl_point(local_2c,y | 1);
      }
    }
    else if (FVar1 == FL_TREE_CONNECTOR_SOLID) {
      fl_line(x1,y | 1U,x2,y | 1U);
    }
  }
  return;
}

Assistant:

void Fl_Tree_Item::draw_horizontal_connector(int x1, int x2, int y, const Fl_Tree_Prefs &prefs) {
  fl_color(prefs.connectorcolor());
  switch ( prefs.connectorstyle() ) {
    case FL_TREE_CONNECTOR_SOLID:
      y |= 1;				// force alignment w/dot pattern
      fl_line(x1,y,x2,y);
      return;
    case FL_TREE_CONNECTOR_DOTTED: 
    {
      y  |= 1;				// force alignment w/dot pattern
      x1 |= 1;
      for ( int xx=x1; xx<=x2; xx+=2 ) {
	fl_point(xx, y);
      }
      return;
    }
    case FL_TREE_CONNECTOR_NONE:
      return;
  }
}